

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O0

void google::protobuf::Any::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  Any *pAVar1;
  Any **v1;
  Any **v2;
  LogMessage *pLVar2;
  ulong uVar3;
  string *psVar4;
  Arena *pAVar5;
  undefined1 auVar6 [16];
  uint32_t cached_has_bits;
  LogMessageFatal local_80 [23];
  Voidify local_69;
  Any *local_68;
  string *local_60;
  string *absl_log_internal_check_op_result;
  Any *from;
  Any *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Any *local_30;
  anon_union_24_1_493b367e_for_Any_4 *local_28;
  string *local_20;
  Any *local_18;
  anon_union_24_1_493b367e_for_Any_4 *local_10;
  
  local_68 = (Any *)from_msg;
  absl_log_internal_check_op_result = (string *)from_msg;
  from = (Any *)to_msg;
  _this = (Any *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Any_const*>
                 (&local_68);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Any*>(&from);
  local_60 = absl::lts_20240722::log_internal::
             Check_NEImpl<google::protobuf::Any_const*,google::protobuf::Any*>
                       (v1,v2,"&from != _this");
  if (local_60 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/any.pb.cc"
               ,0x161,auVar6._0_8_,auVar6._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_80);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_80);
  }
  _internal_type_url_abi_cxx11_((Any *)absl_log_internal_check_op_result);
  uVar3 = std::__cxx11::string::empty();
  pAVar1 = from;
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_type_url_abi_cxx11_((Any *)absl_log_internal_check_op_result);
    local_30 = pAVar1;
    local_28 = &pAVar1->field_0;
    to_msg_local = (MessageLite *)psVar4;
    pAVar5 = MessageLite::GetArena((MessageLite *)pAVar1);
    internal::ArenaStringPtr::Set<>(&(pAVar1->field_0)._impl_.type_url_,psVar4,pAVar5);
  }
  _internal_value_abi_cxx11_((Any *)absl_log_internal_check_op_result);
  uVar3 = std::__cxx11::string::empty();
  pAVar1 = from;
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_value_abi_cxx11_((Any *)absl_log_internal_check_op_result);
    local_18 = pAVar1;
    local_10 = &pAVar1->field_0;
    local_20 = psVar4;
    pAVar5 = MessageLite::GetArena((MessageLite *)pAVar1);
    internal::ArenaStringPtr::Set<>(&(pAVar1->field_0)._impl_.value_,psVar4,pAVar5);
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&absl_log_internal_check_op_result->_M_string_length);
  return;
}

Assistant:

void Any::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Any*>(&to_msg);
  auto& from = static_cast<const Any&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Any)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_type_url().empty()) {
    _this->_internal_set_type_url(from._internal_type_url());
  }
  if (!from._internal_value().empty()) {
    _this->_internal_set_value(from._internal_value());
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}